

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O1

bool __thiscall Clasp::ClaspBerkmin::hasTopUnsat(ClaspBerkmin *this,Solver *s)

{
  size_type sVar1;
  Constraint *pCVar2;
  pointer pLVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  undefined4 in_EAX;
  uint __tmp;
  int iVar7;
  uint uVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar9;
  uint uVar10;
  undefined8 uVar11;
  
  uVar8 = (s->learnts_).ebo_.size;
  uVar9 = -(uint)((int)(this->topConflict_ ^ 0x80000000) < (int)(uVar8 ^ 0x80000000));
  uVar10 = -(uint)((int)(this->topOther_ ^ 0x80000000) < (int)(uVar8 ^ 0x80000000));
  this->topConflict_ = ~uVar9 & uVar8 | this->topConflict_ & uVar9;
  this->topOther_ = ~uVar10 & uVar8 | this->topOther_ & uVar10;
  (this->freeOtherLits_).ebo_.size = 0;
  (this->freeLits_).ebo_.size = 0;
  uVar8 = (this->types_).m;
  uVar11 = CONCAT44(uVar8,in_EAX);
  if ((1 < uVar8) && (uVar8 = this->topOther_, this->topConflict_ < uVar8)) {
    do {
      pCVar2 = (s->learnts_).ebo_.buf[uVar8 - 1];
      iVar7 = (*pCVar2->_vptr_Constraint[0xf])
                        (pCVar2,s,&stack0xffffffffffffffcc,&this->freeLits_,in_R8,in_R9,uVar11);
      if (iVar7 != 0) {
        pLVar3 = (this->freeLits_).ebo_.buf;
        sVar5 = (this->freeLits_).ebo_.size;
        sVar6 = (this->freeLits_).ebo_.cap;
        sVar1 = (this->freeOtherLits_).ebo_.size;
        sVar4 = (this->freeOtherLits_).ebo_.cap;
        (this->freeLits_).ebo_.buf = (this->freeOtherLits_).ebo_.buf;
        (this->freeLits_).ebo_.size = sVar1;
        (this->freeLits_).ebo_.cap = sVar4;
        (this->freeOtherLits_).ebo_.buf = pLVar3;
        (this->freeOtherLits_).ebo_.size = sVar5;
        (this->freeOtherLits_).ebo_.cap = sVar6;
        break;
      }
      uVar8 = this->topOther_ - 1;
      this->topOther_ = uVar8;
      (this->freeLits_).ebo_.size = 0;
    } while (this->topConflict_ < uVar8);
  }
  uVar8 = this->topConflict_;
  uVar9 = uVar8 - this->maxBerkmin_;
  if (uVar8 < this->maxBerkmin_) {
    uVar9 = 0;
  }
  if (uVar8 != uVar9) {
    do {
      pCVar2 = (s->learnts_).ebo_.buf[uVar8 - 1];
      iVar7 = (*pCVar2->_vptr_Constraint[0xf])(pCVar2,s,&stack0xffffffffffffffcc,&this->freeLits_);
      if (iVar7 != 0) {
        if (iVar7 == 1) break;
        this->topOther_ = this->topConflict_;
        pLVar3 = (this->freeLits_).ebo_.buf;
        sVar5 = (this->freeLits_).ebo_.size;
        sVar6 = (this->freeLits_).ebo_.cap;
        sVar1 = (this->freeOtherLits_).ebo_.size;
        sVar4 = (this->freeOtherLits_).ebo_.cap;
        (this->freeLits_).ebo_.buf = (this->freeOtherLits_).ebo_.buf;
        (this->freeLits_).ebo_.size = sVar1;
        (this->freeLits_).ebo_.cap = sVar4;
        (this->freeOtherLits_).ebo_.buf = pLVar3;
        (this->freeOtherLits_).ebo_.size = sVar5;
        (this->freeOtherLits_).ebo_.cap = sVar6;
      }
      uVar8 = this->topConflict_ - 1;
      this->topConflict_ = uVar8;
      (this->freeLits_).ebo_.size = 0;
    } while (uVar8 != uVar9);
  }
  sVar1 = (this->freeOtherLits_).ebo_.size;
  if (sVar1 == 0) {
    this->topOther_ = this->topConflict_;
  }
  if ((this->freeLits_).ebo_.size == 0) {
    pLVar3 = (this->freeOtherLits_).ebo_.buf;
    (this->freeOtherLits_).ebo_.buf = (this->freeLits_).ebo_.buf;
    (this->freeLits_).ebo_.buf = pLVar3;
    (this->freeOtherLits_).ebo_.size = 0;
    (this->freeLits_).ebo_.size = sVar1;
    sVar1 = (this->freeOtherLits_).ebo_.cap;
    (this->freeOtherLits_).ebo_.cap = (this->freeLits_).ebo_.cap;
    (this->freeLits_).ebo_.cap = sVar1;
  }
  return (this->freeLits_).ebo_.size != 0;
}

Assistant:

bool ClaspBerkmin::hasTopUnsat(Solver& s) {
	topConflict_  = std::min(s.numLearntConstraints(), topConflict_);
	topOther_     = std::min(s.numLearntConstraints(), topOther_);
	assert(topConflict_ <= topOther_);
	freeOtherLits_.clear();
	freeLits_.clear();
	TypeSet ts = types_;
	if (ts.m > 1) {
		while (topOther_ > topConflict_) {
			if (s.getLearnt(topOther_-1).isOpen(s, ts, freeLits_) != 0) {
				freeLits_.swap(freeOtherLits_);
				ts.m = 0;
				break;
			}
			--topOther_;
			freeLits_.clear();
		}
	}
	ts.addSet(Constraint_t::Conflict);
	uint32 stopAt = topConflict_ < maxBerkmin_ ? 0 : topConflict_ - maxBerkmin_;
	while (topConflict_ != stopAt) {
		uint32 x = s.getLearnt(topConflict_-1).isOpen(s, ts, freeLits_);
		if (x != 0) {
			if (x == Constraint_t::Conflict) { break; }
			topOther_  = topConflict_;
			freeLits_.swap(freeOtherLits_);
			ts.m = 0;
			ts.addSet(Constraint_t::Conflict);
		}
		--topConflict_;
		freeLits_.clear();
	}
	if (freeOtherLits_.empty())  topOther_ = topConflict_;
	if (freeLits_.empty())      freeOtherLits_.swap(freeLits_);
	return !freeLits_.empty();
}